

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O1

KString * __thiscall
KDIS::GetErrorText_abi_cxx11_(KString *__return_storage_ptr__,KDIS *this,KUINT16 ErrorCode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "No Errors. ";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Buffer Is Too Small. ";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Buffer Does Not Contain Enough Information To Decode. ";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "String Size Too Big. ";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Data Type Is Too Large. ";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Incorrect PDU Type Specified In Header. ";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Could Not Open File For Reading/Writing. ";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Parameter Is Out Of Bounds/Range Of Acceptable Values. ";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Invalid Data. ";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Unsupported Data Type, Can Not Decode. ";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Invalid Operation. ";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Socket error.";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown KDIS Error. ";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static KString GetErrorText( KUINT16 ErrorCode )
{
    switch( ErrorCode )
    {
        case NO_ERRORS:
            return "No Errors. ";
        case BUFFER_TOO_SMALL:
            return "Buffer Is Too Small. ";
        case NOT_ENOUGH_DATA_IN_BUFFER:
            return "Buffer Does Not Contain Enough Information To Decode. ";
        case STRING_PDU_SIZE_TOO_BIG:
            return "String Size Too Big. ";
        case DATA_TYPE_TOO_LARGE:
            return "Data Type Is Too Large. ";
        case WRONG_PDU_TYPE_IN_HEADER:
            return "Incorrect PDU Type Specified In Header. ";
        case FILE_NOT_OPEN:
            return "Could Not Open File For Reading/Writing. ";
        case OUT_OF_BOUNDS:
            return "Parameter Is Out Of Bounds/Range Of Acceptable Values. ";
        case INVALID_DATA:
            return "Invalid Data. ";
        case UNSUPPORTED_DATATYPE:
            return "Unsupported Data Type, Can Not Decode. ";
        case INVALID_OPERATION:
            return "Invalid Operation. ";
        case PDU_TOO_LARGE:
            return "PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.";
        case CONNECTION_SOCKET_ERROR:
            return "Socket error.";
        default:
            return "Unknown KDIS Error. ";
    }
}